

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O2

void __thiscall duckdb::LogicalGet::Serialize(LogicalGet *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WriteProperty<unsigned_long>(serializer,200,"table_index",&this->table_index);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xc9,"returned_types",&this->returned_types);
  Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xca,"names",&this->names);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (serializer,0xcc,"projection_ids",&this->projection_ids);
  Serializer::WriteProperty<duckdb::TableFilterSet>
            (serializer,0xcd,"table_filters",&this->table_filters);
  FunctionSerializer::Serialize<duckdb::TableFunction>
            (serializer,&this->function,
             (optional_ptr<duckdb::FunctionData,_true>)
             (this->bind_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  if ((this->function).serialize == (table_function_serialize_t)0x0) {
    Serializer::WriteProperty<duckdb::vector<duckdb::Value,true>>
              (serializer,0xce,"parameters",&this->parameters);
    Serializer::
    WriteProperty<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              (serializer,0xcf,"named_parameters",&this->named_parameters);
    Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
              (serializer,0xd0,"input_table_types",&this->input_table_types);
    Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
              (serializer,0xd1,"input_table_names",&this->input_table_names);
  }
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (serializer,0xd2,"projected_input",&this->projected_input);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (serializer,0xd3,"column_indexes",&this->column_ids);
  return;
}

Assistant:

void LogicalGet::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "table_index", table_index);
	serializer.WriteProperty(201, "returned_types", returned_types);
	serializer.WriteProperty(202, "names", names);
	/* [Deleted] (vector<column_t>) "column_ids" */
	serializer.WriteProperty(204, "projection_ids", projection_ids);
	serializer.WriteProperty(205, "table_filters", table_filters);
	FunctionSerializer::Serialize(serializer, function, bind_data.get());
	if (!function.serialize) {
		D_ASSERT(!function.serialize);
		// no serialize method: serialize input values and named_parameters for rebinding purposes
		serializer.WriteProperty(206, "parameters", parameters);
		serializer.WriteProperty(207, "named_parameters", named_parameters);
		serializer.WriteProperty(208, "input_table_types", input_table_types);
		serializer.WriteProperty(209, "input_table_names", input_table_names);
	}
	serializer.WriteProperty(210, "projected_input", projected_input);
	serializer.WritePropertyWithDefault(211, "column_indexes", column_ids);
}